

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<(anonymous_namespace)::TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper>
               (TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *testObject,
               TestDetails *details)

{
  TestList *this;
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  TestResults **ppTVar4;
  undefined8 *puVar5;
  Test should_not_run;
  Test should_run;
  SignalTranslator sig;
  int local_524;
  TestDetails local_520;
  Test local_500;
  Test local_4c8;
  SignalTranslator local_490;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    Test::Test(&local_4c8,"goodtest","DefaultSuite","",0);
    this = &(testObject->super_TestRunnerFixture).list;
    TestList::Add(this,&local_4c8);
    iVar2 = 0;
    Test::Test(&local_500,"badtest","DefaultSuite","",0);
    TestList::Add(this,&local_500);
    local_520.suiteName = "goodtest";
    TestRunner::RunTestsIf<(anonymous_namespace)::RunTestIfNameIs>
              (&(testObject->super_TestRunnerFixture).runner,this,(char *)0x0,
               (RunTestIfNameIs *)&local_520,iVar2);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_524 = 1;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_520,*ppTVar3,0x11f);
    CheckEqual<int,int>(pTVar1,&local_524,
                        &(testObject->super_TestRunnerFixture).reporter.testRunCount,&local_520);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_520,*ppTVar3,0x120);
    CheckEqual(pTVar1,"goodtest",(testObject->super_TestRunnerFixture).reporter.lastStartedTest,
               &local_520);
    Test::~Test(&local_500);
    Test::~Test(&local_4c8);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Unhandled system exception";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}